

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# list.c
# Opt level: O1

void list_empty(list *list)

{
  node *pnVar1;
  node *node;
  
  node = list->head;
  while (node != (node *)0x0) {
    pnVar1 = node->next;
    list_remove(list,node);
    node = pnVar1;
  }
  return;
}

Assistant:

void list_empty(struct list *list)
{
        clear_list(list, false);
}